

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O2

LinkedList<data_structures::SymbolTableElement<int,_int>_> * __thiscall
data_structures::LinkedList<data_structures::SymbolTableElement<int,_int>_>::deleteAfterNode
          (LinkedList<data_structures::SymbolTableElement<int,_int>_> *this,
          ListNode<data_structures::SymbolTableElement<int,_int>_> *_previous)

{
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar1;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *temp_node;
  
  pLVar1 = _previous->_next;
  if (pLVar1 != (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
    _previous->_next = pLVar1->_next;
    (*pLVar1->_vptr_ListNode[1])(pLVar1);
  }
  if (pLVar1 == this->_tail) {
    this->_tail = _previous;
  }
  this->_size = this->_size - 1;
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::deleteAfterNode(ListNode<T>* _previous){
        ListNode<T>* _current = _previous->next();
        _previous->deleteAfter();
        delete _current;
        if (_current == _tail) {
            _tail = _previous;
        }
        _size--;
        return this;
    }